

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O1

void __thiscall
Assimp::ObjExporter::AddMesh(ObjExporter *this,aiString *name,aiMesh *m,aiMatrix4x4 *mat)

{
  pointer pFVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  undefined4 uVar6;
  pointer pMVar7;
  aiFace *paVar8;
  aiVector3D *paVar9;
  aiColor4D *paVar10;
  undefined4 uVar11;
  int iVar12;
  ulong uVar13;
  char cVar14;
  long lVar15;
  ulong uVar16;
  vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_> *this_00
  ;
  undefined1 local_98 [8];
  float fStack_90;
  ai_real aStack_8c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_88;
  _Alloc_hider local_78;
  size_type sStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_> local_58;
  ulong local_40;
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare> *local_38;
  
  aStack_88._M_allocated_capacity._4_4_ = 0.0;
  aStack_88._8_8_ = 0;
  local_68._8_8_ = 0;
  local_58.super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fStack_90 = 0.0;
  aStack_8c = 0.0;
  aStack_88._M_allocated_capacity._0_4_ = 0;
  sStack_70 = 0;
  local_68._M_allocated_capacity = 0;
  local_98 = (undefined1  [8])&aStack_88;
  local_78._M_p = (pointer)&local_68;
  std::vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ::emplace_back<Assimp::ObjExporter::MeshInstance>(&this->mMeshes,(MeshInstance *)local_98);
  std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>::~vector
            (&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  if (local_98 != (undefined1  [8])&aStack_88) {
    operator_delete((void *)local_98,
                    CONCAT44(aStack_88._M_allocated_capacity._4_4_,
                             aStack_88._M_allocated_capacity._0_4_) + 1);
  }
  pMVar7 = (this->mMeshes).
           super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (m->mColors[0] != (aiColor4D *)0x0) {
    this->useVc = true;
  }
  local_98 = (undefined1  [8])&aStack_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,name->data,name->data + name->length);
  std::__cxx11::string::operator=((string *)(pMVar7 + -1),(string *)local_98);
  if (local_98 != (undefined1  [8])&aStack_88) {
    operator_delete((void *)local_98,
                    CONCAT44(aStack_88._M_allocated_capacity._4_4_,
                             aStack_88._M_allocated_capacity._0_4_) + 1);
  }
  GetMaterialName_abi_cxx11_((string *)local_98,this,m->mMaterialIndex);
  std::__cxx11::string::operator=((string *)&pMVar7[-1].matname,(string *)local_98);
  if (local_98 != (undefined1  [8])&aStack_88) {
    operator_delete((void *)local_98,
                    CONCAT44(aStack_88._M_allocated_capacity._4_4_,
                             aStack_88._M_allocated_capacity._0_4_) + 1);
  }
  std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>::resize
            (&pMVar7[-1].faces,(ulong)m->mNumFaces);
  if (m->mNumFaces != 0) {
    local_38 = &this->mVnMap;
    uVar13 = 0;
    do {
      paVar8 = m->mFaces;
      cVar14 = 'f';
      if (paVar8[uVar13].mNumIndices == 2) {
        cVar14 = 'l';
      }
      if (paVar8[uVar13].mNumIndices == 1) {
        cVar14 = 'p';
      }
      pFVar1 = pMVar7[-1].faces.
               super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar13;
      this_00 = &pFVar1->indices;
      pFVar1->kind = cVar14;
      local_40 = uVar13;
      std::vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
      ::resize(this_00,(ulong)paVar8[uVar13].mNumIndices);
      if (paVar8[uVar13].mNumIndices != 0) {
        lVar15 = 0;
        uVar16 = 0;
        do {
          uVar5 = paVar8[uVar13].mIndices[uVar16];
          paVar9 = m->mVertices;
          paVar10 = m->mColors[0];
          fVar2 = paVar9[uVar5].x;
          fVar3 = paVar9[uVar5].y;
          fVar4 = paVar9[uVar5].z;
          fStack_90 = fVar4 * mat->c3 + fVar2 * mat->c1 + fVar3 * mat->c2 + mat->c4;
          if (paVar10 == (aiColor4D *)0x0) {
            aStack_8c = 0.0;
            aStack_88._M_allocated_capacity._0_4_ = 0;
            aStack_88._M_allocated_capacity._4_4_ = 0.0;
          }
          else {
            uVar6 = paVar10[uVar5].r;
            uVar11 = paVar10[uVar5].g;
            aStack_88._M_allocated_capacity._4_4_ = paVar10[uVar5].b;
            aStack_8c = (ai_real)uVar6;
            aStack_88._M_allocated_capacity._0_4_ = uVar11;
          }
          local_98._4_4_ = mat->b3 * fVar4 + mat->b1 * fVar2 + mat->b2 * fVar3 + mat->b4;
          local_98._0_4_ = mat->a3 * fVar4 + mat->a1 * fVar2 + mat->a2 * fVar3 + mat->a4;
          iVar12 = indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>
                   ::getIndex(&this->mVpMap,(vertexData *)local_98);
          *(int *)((long)&((this_00->
                           super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                           )._M_impl.super__Vector_impl_data._M_start)->vp + lVar15) = iVar12;
          paVar9 = m->mNormals;
          if (paVar9 == (aiVector3D *)0x0) {
            *(undefined4 *)
             ((long)&((this_00->
                      super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                      )._M_impl.super__Vector_impl_data._M_start)->vn + lVar15) = 0;
          }
          else {
            fVar2 = paVar9[uVar5].x;
            fVar3 = paVar9[uVar5].y;
            fVar4 = paVar9[uVar5].z;
            fStack_90 = fVar4 * mat->c3 + fVar2 * mat->c1 + fVar3 * mat->c2;
            local_98 = (undefined1  [8])
                       CONCAT44(mat->b3 * fVar4 + mat->b1 * fVar2 + mat->b2 * fVar3,
                                mat->a3 * fVar4 + mat->a1 * fVar2 + mat->a2 * fVar3);
            iVar12 = indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getIndex
                               (local_38,(aiVector3t<float> *)local_98);
            *(int *)((long)&((this_00->
                             super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                             )._M_impl.super__Vector_impl_data._M_start)->vn + lVar15) = iVar12;
          }
          if (m->mTextureCoords[0] == (aiVector3D *)0x0) {
            iVar12 = 0;
          }
          else {
            iVar12 = indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getIndex
                               (&this->mVtMap,m->mTextureCoords[0] + uVar5);
          }
          *(int *)((long)&((this_00->
                           super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                           )._M_impl.super__Vector_impl_data._M_start)->vt + lVar15) = iVar12;
          uVar16 = uVar16 + 1;
          lVar15 = lVar15 + 0xc;
        } while (uVar16 < paVar8[uVar13].mNumIndices);
      }
      uVar13 = local_40 + 1;
    } while (uVar13 < m->mNumFaces);
  }
  return;
}

Assistant:

void ObjExporter::AddMesh(const aiString& name, const aiMesh* m, const aiMatrix4x4& mat) {
    mMeshes.push_back(MeshInstance() );
    MeshInstance& mesh = mMeshes.back();

    if ( nullptr != m->mColors[ 0 ] ) {
        useVc = true;
    }

    mesh.name = std::string( name.data, name.length );
    mesh.matname = GetMaterialName(m->mMaterialIndex);

    mesh.faces.resize(m->mNumFaces);

    for(unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];

        Face& face = mesh.faces[i];
        switch (f.mNumIndices) {
            case 1:
                face.kind = 'p';
                break;
            case 2:
                face.kind = 'l';
                break;
            default:
                face.kind = 'f';
        }
        face.indices.resize(f.mNumIndices);

        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const unsigned int idx = f.mIndices[a];

            aiVector3D vert = mat * m->mVertices[idx];

            if ( nullptr != m->mColors[ 0 ] ) {
                aiColor4D col4 = m->mColors[ 0 ][ idx ];
                face.indices[a].vp = mVpMap.getIndex({vert, aiColor3D(col4.r, col4.g, col4.b)});
            } else {
                face.indices[a].vp = mVpMap.getIndex({vert, aiColor3D(0,0,0)});
            }

            if (m->mNormals) {
                aiVector3D norm = aiMatrix3x3(mat) * m->mNormals[idx];
                face.indices[a].vn = mVnMap.getIndex(norm);
            } else {
                face.indices[a].vn = 0;
            }

            if ( m->mTextureCoords[ 0 ] ) {
                face.indices[a].vt = mVtMap.getIndex(m->mTextureCoords[0][idx]);
            } else {
                face.indices[a].vt = 0;
            }
        }
    }
}